

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

UBool __thiscall
icu_63::TZDBNameSearchHandler::handleMatch
          (TZDBNameSearchHandler *this,int32_t matchLength,CharacterNode *node,UErrorCode *status)

{
  UElement *pUVar1;
  ulong uVar2;
  int iVar3;
  UVector *this_00;
  MatchInfoCollection *this_01;
  UVector *pUVar4;
  ulong uVar5;
  UVector *pUVar6;
  UTimeZoneNameType nameType;
  undefined4 in_register_00000034;
  char *__s2;
  char *pcVar7;
  uint uVar8;
  int index;
  uint uVar9;
  UBool UVar10;
  ulong uVar11;
  bool bVar12;
  UVector *local_88;
  UnicodeString local_70;
  
  __s2 = (char *)CONCAT44(in_register_00000034,matchLength);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar10 = '\x01';
    if (node->fValues != (void *)0x0) {
      if (node->fHasValuesVector == '\0') {
        uVar8 = 1;
      }
      else {
        uVar8 = *(uint *)((long)node->fValues + 8);
        if ((int)uVar8 < 1) {
          return '\x01';
        }
      }
      pUVar4 = (UVector *)0x0;
      local_88 = (UVector *)0x0;
      pcVar7 = (char *)0x0;
      do {
        this_00 = (UVector *)node->fValues;
        index = (int)pcVar7;
        if (node->fHasValuesVector != '\0') {
          this_00 = (UVector *)UVector::elementAt(this_00,index);
          __s2 = pcVar7;
        }
        if ((this_00 != (UVector *)0x0) && ((this_00->count & this->fTypes) != 0)) {
          pUVar1 = this_00->elements;
          if (pUVar1 == (UElement *)0x0) {
            if (local_88 == (UVector *)0x0) {
              pUVar4 = this_00;
              local_88 = this_00;
            }
          }
          else {
            uVar11 = (ulong)*(int *)&this_00->deleter;
            if ((long)uVar11 < 1) {
              if (pUVar4 == (UVector *)0x0) {
                pUVar4 = this_00;
              }
            }
            else {
              pcVar7 = this->fRegion;
              __s2 = (char *)pUVar1->pointer;
              iVar3 = strcmp(pcVar7,__s2);
              if (iVar3 == 0) {
                bVar12 = true;
                pUVar6 = this_00;
              }
              else {
                uVar2 = 1;
                do {
                  uVar5 = uVar2;
                  pUVar6 = pUVar4;
                  if (uVar11 == uVar5) break;
                  __s2 = (char *)pUVar1[uVar5].pointer;
                  iVar3 = strcmp(pcVar7,__s2);
                  uVar2 = uVar5 + 1;
                  pUVar6 = this_00;
                } while (iVar3 != 0);
                bVar12 = uVar5 < uVar11;
              }
              if (pUVar6 != (UVector *)0x0) {
                this_00 = pUVar6;
              }
              pUVar4 = this_00;
              if (bVar12) break;
            }
          }
        }
        uVar9 = index + 1;
        pcVar7 = (char *)(ulong)uVar9;
        pUVar6 = pUVar4;
      } while (uVar9 != uVar8);
      UVar10 = '\x01';
      if (pUVar6 != (UVector *)0x0) {
        nameType = pUVar6->count;
        if (((char)pUVar6->capacity != '\0') &&
           (((nameType == UTZNM_SHORT_DAYLIGHT || (nameType == UTZNM_SHORT_STANDARD)) &&
            ((~this->fTypes & 0x30) == 0)))) {
          nameType = UTZNM_SHORT_GENERIC;
        }
        this_01 = this->fResults;
        if (this_01 == (MatchInfoCollection *)0x0) {
          this_01 = (MatchInfoCollection *)UMemory::operator_new((UMemory *)0x10,(size_t)__s2);
          if (this_01 == (MatchInfoCollection *)0x0) {
            this->fResults = (MatchInfoCollection *)0x0;
            *status = U_MEMORY_ALLOCATION_ERROR;
            return '\x01';
          }
          TimeZoneNames::MatchInfoCollection::MatchInfoCollection(this_01);
          this->fResults = this_01;
        }
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          UnicodeString::UnicodeString(&local_70,(UChar *)(pUVar6->super_UObject)._vptr_UObject,-1);
          TimeZoneNames::MatchInfoCollection::addMetaZone
                    (this_01,nameType,matchLength,&local_70,status);
          UnicodeString::~UnicodeString(&local_70);
          if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (this->fMaxMatchLen < matchLength)) {
            this->fMaxMatchLen = matchLength;
          }
        }
      }
    }
  }
  else {
    UVar10 = '\0';
  }
  return UVar10;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }